

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O0

int BN_lshift(BIGNUM *r,BIGNUM *a,int n)

{
  ulong *puVar1;
  ulong *__s;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  BIGNUM *pBVar5;
  int iVar6;
  unsigned_long l;
  unsigned_long *f;
  unsigned_long *t;
  int rb;
  int lb;
  int nw;
  int i;
  undefined8 in_stack_ffffffffffffffb8;
  BIGNUM *in_stack_ffffffffffffffc0;
  int local_20;
  int local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else {
    r->neg = a->neg;
    iVar4 = n / 0x40;
    pBVar5 = bn_wexpand(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (pBVar5 == (BIGNUM *)0x0) {
      local_4 = 0;
    }
    else {
      bVar3 = (byte)(n % 0x40);
      puVar1 = a->d;
      __s = r->d;
      __s[a->top + iVar4] = 0;
      if (n % 0x40 == 0) {
        local_20 = a->top;
        while (local_20 = local_20 + -1, -1 < local_20) {
          __s[iVar4 + local_20] = puVar1[local_20];
        }
      }
      else {
        local_20 = a->top;
        while (local_20 = local_20 + -1, -1 < local_20) {
          uVar2 = puVar1[local_20];
          iVar6 = iVar4 + local_20 + 1;
          __s[iVar6] = uVar2 >> (0x40 - bVar3 & 0x3f) | __s[iVar6];
          __s[iVar4 + local_20] = uVar2 << (bVar3 & 0x3f);
        }
      }
      memset(__s,0,(long)iVar4 << 3);
      r->top = a->top + iVar4 + 1;
      bn_correct_top((BIGNUM *)r);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int BN_lshift(BIGNUM *r, const BIGNUM *a, int n)
{
    int i, nw, lb, rb;
    BN_ULONG *t, *f;
    BN_ULONG l;

    bn_check_top(r);
    bn_check_top(a);

    if (n < 0) {
        //BNerr(BN_F_BN_LSHIFT, BN_R_INVALID_SHIFT);
        return 0;
    }

    r->neg = a->neg;
    nw = n / BN_BITS2;
    if (bn_wexpand(r, a->top + nw + 1) == NULL)
        return (0);
    lb = n % BN_BITS2;
    rb = BN_BITS2 - lb;
    f = a->d;
    t = r->d;
    t[a->top + nw] = 0;
    if (lb == 0)
        for (i = a->top - 1; i >= 0; i--)
            t[nw + i] = f[i];
    else
        for (i = a->top - 1; i >= 0; i--) {
            l = f[i];
            t[nw + i + 1] |= (l >> rb) & BN_MASK2;
            t[nw + i] = (l << lb) & BN_MASK2;
        }
    memset(t, 0, sizeof(*t) * nw);
    r->top = a->top + nw + 1;
    bn_correct_top(r);
    bn_check_top(r);
    return (1);
}